

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O2

void __thiscall Parse::Object::setPosition(Object *this,string *anchor,string *coordN)

{
  bool bVar1;
  Position *pPVar2;
  
  if (this->position == (Position *)0x0) {
    pPVar2 = (Position *)operator_new(0x40);
    (pPVar2->y)._M_dataplus._M_p = (pointer)0x0;
    (pPVar2->y)._M_string_length = 0;
    (pPVar2->y).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(pPVar2->y).field_2 + 8) = 0;
    (pPVar2->x).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(pPVar2->x).field_2 + 8) = 0;
    (pPVar2->x)._M_dataplus._M_p = (pointer)&(pPVar2->x).field_2;
    (pPVar2->x)._M_string_length = 0;
    (pPVar2->y)._M_dataplus._M_p = (pointer)&(pPVar2->y).field_2;
    (pPVar2->y).field_2._M_local_buf[0] = '\0';
    this->position = pPVar2;
  }
  bVar1 = std::operator==(anchor,"x");
  if (bVar1) {
    std::__cxx11::string::assign((char *)this->position);
  }
  bVar1 = std::operator==(anchor,"y");
  if (bVar1) {
    std::__cxx11::string::assign((char *)this->position);
    return;
  }
  return;
}

Assistant:

void setPosition(std::string anchor, std::string coordN) {
                if (position == NULL) {
                    position = new Position();
                }
                if (anchor == "x") {
                    position->x = (coordN.c_str());
                }
                if (anchor == "y") {
                    position->x = (coordN.c_str());
                }
            }